

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1_dx_iface.c
# Opt level: O2

aom_codec_err_t ctrl_get_mi_info(aom_codec_alg_priv_t *ctx,__va_list_tag *args)

{
  uint uVar1;
  int *piVar2;
  long *plVar3;
  long lVar4;
  aom_codec_err_t aVar5;
  ulong uVar6;
  undefined8 *puVar7;
  int iVar8;
  aom_codec_err_t aVar9;
  int iVar10;
  
  uVar1 = args->gp_offset;
  uVar6 = (ulong)uVar1;
  if (uVar6 < 0x29) {
    args->gp_offset = uVar1 + 8;
    iVar8 = *(int *)((long)args->reg_save_area + uVar6);
    if (0x20 < uVar1) goto LAB_00166cd0;
    args->gp_offset = (uint)(uVar6 + 0x10);
    iVar10 = *(int *)((long)args->reg_save_area + uVar6 + 8);
    if (uVar1 < 0x19) {
      puVar7 = (undefined8 *)(uVar6 + 0x10 + (long)args->reg_save_area);
      args->gp_offset = uVar1 + 0x18;
      goto LAB_00166ceb;
    }
  }
  else {
    piVar2 = (int *)args->overflow_arg_area;
    args->overflow_arg_area = piVar2 + 2;
    iVar8 = *piVar2;
LAB_00166cd0:
    piVar2 = (int *)args->overflow_arg_area;
    args->overflow_arg_area = piVar2 + 2;
    iVar10 = *piVar2;
  }
  puVar7 = (undefined8 *)args->overflow_arg_area;
  args->overflow_arg_area = puVar7 + 1;
LAB_00166ceb:
  aVar9 = AOM_CODEC_INVALID_PARAM;
  if ((void *)*puVar7 == (void *)0x0) {
    return aVar9;
  }
  aVar5 = AOM_CODEC_ERROR;
  if ((ctx->frame_worker != (AVxWorker *)0x0) &&
     (plVar3 = (long *)ctx->frame_worker->data1, plVar3 != (long *)0x0)) {
    if (iVar8 < 0) {
      return aVar9;
    }
    lVar4 = *plVar3;
    if (*(int *)(lVar4 + 0x3d74) <= iVar8) {
      return aVar9;
    }
    if (iVar10 < 0) {
      return aVar9;
    }
    aVar5 = aVar9;
    if (iVar10 < *(int *)(lVar4 + 0x3d78)) {
      memcpy((void *)*puVar7,
             *(void **)(*(long *)(lVar4 + 0x3d98) +
                       (long)(iVar8 * *(int *)(lVar4 + 0x3da4) + iVar10) * 8),0xb0);
      aVar5 = AOM_CODEC_OK;
    }
  }
  return aVar5;
}

Assistant:

static aom_codec_err_t ctrl_get_mi_info(aom_codec_alg_priv_t *ctx,
                                        va_list args) {
  int mi_row = va_arg(args, int);
  int mi_col = va_arg(args, int);
  MB_MODE_INFO *mi = va_arg(args, MB_MODE_INFO *);
  if (mi == NULL) return AOM_CODEC_INVALID_PARAM;
  if (ctx->frame_worker == NULL) return AOM_CODEC_ERROR;
  FrameWorkerData *const frame_worker_data =
      (FrameWorkerData *)ctx->frame_worker->data1;
  if (frame_worker_data == NULL) return AOM_CODEC_ERROR;

  AV1_COMMON *cm = &frame_worker_data->pbi->common;
  const int mi_rows = cm->mi_params.mi_rows;
  const int mi_cols = cm->mi_params.mi_cols;
  const int mi_stride = cm->mi_params.mi_stride;
  const int offset = mi_row * mi_stride + mi_col;

  if (mi_row < 0 || mi_row >= mi_rows || mi_col < 0 || mi_col >= mi_cols) {
    return AOM_CODEC_INVALID_PARAM;
  }

  memcpy(mi, cm->mi_params.mi_grid_base[offset], sizeof(*mi));

  return AOM_CODEC_OK;
}